

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

string * formatString<char_const*,int,int>
                   (string *__return_storage_ptr__,char *fmt,char *args,int args_1,int args_2)

{
  ulong __maxlen;
  int iVar1;
  char *__s;
  
  iVar1 = snprintf((char *)0x0,0,fmt,args,(ulong)(uint)args_1,(ulong)(uint)args_2);
  __maxlen = (long)iVar1 + 1;
  __s = (char *)operator_new__(__maxlen);
  snprintf(__s,__maxlen,fmt,args,args_1,(ulong)(uint)args_2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s,__s + iVar1);
  operator_delete__(__s);
  return __return_storage_ptr__;
}

Assistant:

std::string formatString(const char* fmt, Args... args) {
    // Determine required size (+1 for '\0')
    size_t size = snprintf(nullptr, 0, fmt, args...) + 1;
    // Allocate necessary buffer
    std::unique_ptr<char[]> buffer(new char[size]);

    // Write string format to buffer
    snprintf(buffer.get(), size, fmt, args...);
    return std::string(buffer.get(), buffer.get() + size - 1);
}